

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# closefd.c
# Opt level: O2

void nn_closefd(int fd)

{
  uint errnum;
  FILE *__stream;
  int iVar1;
  uint *puVar2;
  char *pcVar3;
  
  if (-1 < fd) {
    iVar1 = close(fd);
    if (iVar1 != 0) {
      puVar2 = (uint *)__errno_location();
      __stream = _stderr;
      errnum = *puVar2;
      if ((((0xb < errnum - 0x68) || ((0x841U >> (errnum - 0x68 & 0x1f) & 1) == 0)) && (errnum != 4)
          ) && (errnum != 0xb)) {
        pcVar3 = nn_err_strerror(errnum);
        fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar3,(ulong)*puVar2,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/utils/closefd.c"
                ,0x2a);
        fflush(_stderr);
        nn_err_abort();
      }
    }
  }
  return;
}

Assistant:

void nn_closefd (int fd)
{
    int rc;
    if (nn_slow (fd < 0)) {
        return;
    }
    rc = close (fd);
    if (nn_fast (rc == 0))
        return;
    errno_assert (errno == EINTR || errno == ETIMEDOUT ||
        errno == EWOULDBLOCK || errno == EINPROGRESS || errno == ECONNRESET);
}